

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O2

void anon_unknown.dwarf_c2849::assert_is_valid_utf8
               (bool expected,int length,int cu0,int cu1,int cu2,int cu3)

{
  bool bVar1;
  size_t s_length;
  undefined7 in_register_00000039;
  int iVar2;
  undefined4 in_register_0000008c;
  char buf [4];
  AssertionResult gtest_ar_;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  
  buf[0] = (char)cu0;
  buf[1] = (char)cu1;
  buf[2] = (char)cu2;
  buf[3] = (char)cu3;
  iVar2 = cu3;
  if ((int)CONCAT71(in_register_00000039,expected) != 0) {
    for (s_length = 1; (long)s_length < (long)length; s_length = s_length + 1) {
      bVar1 = wabt::IsValidUtf8(buf,s_length);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_58);
        std::ostream::operator<<(local_58.ptr_ + 0x10,cu0);
        std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
        std::ostream::operator<<(local_58.ptr_ + 0x10,cu1);
        std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
        std::ostream::operator<<(local_58.ptr_ + 0x10,cu2);
        std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
        std::ostream::operator<<(local_58.ptr_ + 0x10,cu3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,
                   (AssertionResult *)"IsValidUtf8(buf, bad_length)","true","false",
                   (char *)CONCAT44(in_register_0000008c,iVar2));
        iVar2 = 0x26;
        goto LAB_002080c2;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
  }
  bVar1 = wabt::IsValidUtf8(buf,(ulong)(uint)length);
  gtest_ar_.success_ = bVar1 == expected;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_58);
    std::ostream::operator<<(local_58.ptr_ + 0x10,cu0);
    std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
    std::ostream::operator<<(local_58.ptr_ + 0x10,cu1);
    std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
    std::ostream::operator<<(local_58.ptr_ + 0x10,cu2);
    std::operator<<((ostream *)(local_58.ptr_ + 0x10),", ");
    std::ostream::operator<<(local_58.ptr_ + 0x10,cu3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,
               (AssertionResult *)"expected == IsValidUtf8(buf, length)","false","true",
               (char *)CONCAT44(in_register_0000008c,iVar2));
    iVar2 = 0x2b;
LAB_002080c2:
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-utf8.cc"
               ,iVar2,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::_M_dispose();
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

void assert_is_valid_utf8(bool expected,
                          int length,
                          int cu0 = 0,
                          int cu1 = 0,
                          int cu2 = 0,
                          int cu3 = 0) {
  assert(length <= 4);
  char buf[4] = {static_cast<char>(cu0), static_cast<char>(cu1),
                 static_cast<char>(cu2), static_cast<char>(cu3)};
  if (expected) {
    // Make sure it fails if there are continuation bytes past the end of the
    // string.
    for (int bad_length = 1; bad_length < length; ++bad_length) {
      ASSERT_FALSE(IsValidUtf8(buf, bad_length))
          << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
    }
  }

  ASSERT_TRUE(expected == IsValidUtf8(buf, length))
      << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
}